

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O2

void __thiscall Assimp::COB::Node::~Node(Node *this)

{
  this->_vptr_Node = (_func_int **)&PTR__Node_0075c958;
  std::__cxx11::string::~string((string *)&this->name);
  std::_Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::
  ~_Deque_base(&(this->temp_children).
                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              );
  return;
}

Assistant:

virtual ~Node() {}